

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::checkUnknown(SVInt *this)

{
  bitwidth_t bVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *__src;
  uint uVar2;
  ulong n;
  
  if ((this->super_SVIntStorage).unknownFlag != true) {
    return;
  }
  uVar2 = (this->super_SVIntStorage).bitWidth;
  bVar1 = countLeadingZerosSlowCase(this);
  if (bVar1 < uVar2) {
    return;
  }
  (this->super_SVIntStorage).unknownFlag = false;
  uVar2 = uVar2 + 0x3f >> 6;
  if (uVar2 == 1) {
    __src = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this->super_SVIntStorage).field_0.pVal;
    __dest = *__src;
  }
  else {
    n = (ulong)(uVar2 << 3);
    __dest.pVal = (uint64_t *)operator_new__(n);
    __src = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this->super_SVIntStorage).field_0.pVal;
    memcpy(__dest.pVal,__src,n);
    if (__src == (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0) goto LAB_001fad54;
  }
  operator_delete__(__src);
LAB_001fad54:
  (this->super_SVIntStorage).field_0 = __dest;
  return;
}

Assistant:

void SVInt::checkUnknown() {
    // check if we've lost all of our unknown bits and need
    // to downgrade back to a non-unknown value
    if (!unknownFlag || countLeadingZeros() < bitWidth)
        return;

    unknownFlag = false;
    uint32_t words = getNumWords();
    if (words == 1) {
        uint64_t newVal = pVal[0];
        delete[] pVal;
        val = newVal;
    }
    else {
        uint64_t* newMem = new uint64_t[words];
        memcpy(newMem, pVal, words * WORD_SIZE);
        delete[] pVal;
        pVal = newMem;
    }
}